

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.h
# Opt level: O0

BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
cmComputeLinkInformation::Item::GetFormattedItem
          (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Item *this,string *path)

{
  cmListFileBacktrace local_68;
  byte local_55;
  byte local_41;
  string local_40;
  string *local_20;
  string *path_local;
  Item *this_local;
  
  local_41 = 0;
  local_55 = 0;
  local_20 = path;
  path_local = (string *)this;
  this_local = (Item *)__return_storage_ptr__;
  if (this->Feature == (FeatureDescriptor *)0x0) {
    std::__cxx11::string::string((string *)&local_40,(string *)path);
    local_55 = 1;
  }
  else {
    FeatureDescriptor::GetDecoratedItem(&local_40,this->Feature,path,this->IsPath);
    local_41 = 1;
  }
  cmListFileBacktrace::cmListFileBacktrace(&local_68,&(this->Value).Backtrace);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (__return_storage_ptr__,&local_40,&local_68);
  cmListFileBacktrace::~cmListFileBacktrace(&local_68);
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

BT<std::string> GetFormattedItem(std::string const& path) const
    {
      return { (this->Feature != nullptr)
                 ? this->Feature->GetDecoratedItem(path, this->IsPath)
                 : path,
               Value.Backtrace };
    }